

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void free_parser(vw *all)

{
  substring *psVar1;
  unsigned_long *puVar2;
  io_buf *piVar3;
  char *pcVar4;
  _Map_pointer pppeVar5;
  example *peVar6;
  parser *ppVar7;
  
  ppVar7 = all->p;
  psVar1 = (ppVar7->words)._begin;
  if (psVar1 != (substring *)0x0) {
    free(psVar1);
  }
  (ppVar7->words)._begin = (substring *)0x0;
  (ppVar7->words)._end = (substring *)0x0;
  (ppVar7->words).end_array = (substring *)0x0;
  ppVar7 = all->p;
  psVar1 = (ppVar7->name)._begin;
  if (psVar1 != (substring *)0x0) {
    free(psVar1);
  }
  (ppVar7->name)._begin = (substring *)0x0;
  (ppVar7->name)._end = (substring *)0x0;
  (ppVar7->name).end_array = (substring *)0x0;
  if ((all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (all->ngram_strings).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVar7 = all->p;
    puVar2 = (ppVar7->gram_mask)._begin;
    if (puVar2 != (unsigned_long *)0x0) {
      free(puVar2);
    }
    (ppVar7->gram_mask)._begin = (unsigned_long *)0x0;
    (ppVar7->gram_mask)._end = (unsigned_long *)0x0;
    (ppVar7->gram_mask).end_array = (unsigned_long *)0x0;
  }
  ppVar7 = all->p;
  piVar3 = ppVar7->output;
  if (piVar3 == (io_buf *)0x0) goto LAB_001b2858;
  pcVar4 = (piVar3->finalname)._begin;
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
  }
  (piVar3->finalname)._begin = (char *)0x0;
  (piVar3->finalname)._end = (char *)0x0;
  (piVar3->finalname).end_array = (char *)0x0;
  pcVar4 = (piVar3->currentname)._begin;
  if (pcVar4 != (char *)0x0) {
    free(pcVar4);
  }
  (piVar3->currentname)._begin = (char *)0x0;
  (piVar3->currentname)._end = (char *)0x0;
  (piVar3->currentname).end_array = (char *)0x0;
  while( true ) {
    ppVar7 = all->p;
LAB_001b2858:
    if ((ppVar7->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (ppVar7->example_pool).m_pool.c.super__Deque_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) break;
    peVar6 = VW::object_pool<example,_example_initializer>::get_object(&ppVar7->example_pool);
    VW::dealloc_example((all->p->lp).delete_label,peVar6,all->delete_prediction);
  }
  while (pppeVar5 = *(_Map_pointer *)
                     ((long)&(ppVar7->ready_parsed_examples).object_queue.c.
                             super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                             super__Deque_impl_data._M_finish + 0x18),
        ((long)*(_Elt_pointer *)
                ((long)&(ppVar7->ready_parsed_examples).object_queue.c.
                        super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Deque_impl_data._M_start + 0x10) -
         (long)(ppVar7->ready_parsed_examples).object_queue.c.
               super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)(ppVar7->ready_parsed_examples).object_queue.c.
               super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)*(_Elt_pointer *)
                ((long)&(ppVar7->ready_parsed_examples).object_queue.c.
                        super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Deque_impl_data._M_finish + 8) >> 3) +
        ((((ulong)((long)pppeVar5 -
                  (long)*(_Map_pointer *)
                         ((long)&(ppVar7->ready_parsed_examples).object_queue.c.
                                 super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                                 super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
        (ulong)(pppeVar5 == (_Map_pointer)0x0)) * 0x40 != 0) {
    peVar6 = VW::ptr_queue<example>::pop(&ppVar7->ready_parsed_examples);
    VW::dealloc_example((all->p->lp).delete_label,peVar6,all->delete_prediction);
    ppVar7 = all->p;
  }
  puVar2 = (ppVar7->counts)._begin;
  if (puVar2 != (unsigned_long *)0x0) {
    free(puVar2);
  }
  (ppVar7->counts)._begin = (unsigned_long *)0x0;
  (ppVar7->counts)._end = (unsigned_long *)0x0;
  (ppVar7->counts).end_array = (unsigned_long *)0x0;
  return;
}

Assistant:

void free_parser(vw& all)
{
  all.p->words.delete_v();
  all.p->name.delete_v();

  if (all.ngram_strings.size() > 0)
    all.p->gram_mask.delete_v();

  io_buf* output = all.p->output;
  if (output != nullptr)
  {
    output->finalname.delete_v();
    output->currentname.delete_v();
  }

  while (! all.p->example_pool.empty())
    {
      example* temp = all.p->example_pool.get_object();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }

  while (all.p->ready_parsed_examples.size() != 0)
    {
      example* temp = all.p->ready_parsed_examples.pop();
      VW::dealloc_example(all.p->lp.delete_label, *temp, all.delete_prediction);
    }
  all.p->counts.delete_v();
}